

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O2

ExpressionSyntax * __thiscall
slang::parsing::Parser::parseNewExpression
          (Parser *this,NameSyntax *newKeyword,
          bitmask<slang::parsing::detail::ExpressionOptions> options)

{
  bool bVar1;
  ExpressionSyntax *pEVar2;
  ExpressionSyntax *expression;
  ParenthesizedExpressionSyntax *initializer;
  ScopedNameSyntax *pSVar3;
  NameSyntax *pNVar4;
  SyntaxNode *pSVar5;
  SourceLocation SVar6;
  Diagnostic *pDVar7;
  ArgumentListSyntax *argList;
  NewArrayExpressionSyntax *pNVar8;
  CopyClassExpressionSyntax *pCVar9;
  TokenKind kind;
  Token TVar10;
  Token closeBracket;
  Token openParen;
  Token closeParen;
  SourceRange SVar11;
  Token local_40;
  
  TVar10 = ParserBase::peek(&this->super_ParserBase);
  kind = TVar10.kind;
  if (kind == OpenBracket) {
    TVar10 = ParserBase::consume(&this->super_ParserBase);
    pEVar2 = parseExpression(this);
    closeBracket = ParserBase::expect(&this->super_ParserBase,CloseBracket);
    bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
    if (bVar1) {
      openParen = ParserBase::consume(&this->super_ParserBase);
      expression = parseExpression(this);
      closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      initializer = slang::syntax::SyntaxFactory::parenthesizedExpression
                              (&this->factory,openParen,expression,closeParen);
    }
    else {
      initializer = (ParenthesizedExpressionSyntax *)0x0;
    }
    pNVar8 = slang::syntax::SyntaxFactory::newArrayExpression
                       (&this->factory,newKeyword,TVar10,pEVar2,closeBracket,initializer);
  }
  else {
    if ((newKeyword->super_ExpressionSyntax).super_SyntaxNode.kind == ScopedName) {
      pSVar3 = slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>
                         ((SyntaxNode *)newKeyword);
      pNVar4 = not_null<slang::syntax::NameSyntax_*>::get(&pSVar3->right);
      if ((pNVar4->super_ExpressionSyntax).super_SyntaxNode.kind == ConstructorName) {
        pSVar5 = (SyntaxNode *)not_null<slang::syntax::NameSyntax_*>::get(&pSVar3->left);
        TVar10 = slang::syntax::SyntaxNode::getLastToken(pSVar5);
        if ((options.m_bits & 8) == 0 && TVar10.kind == SuperKeyword) {
          pSVar5 = (SyntaxNode *)not_null<slang::syntax::NameSyntax_*>::get(&pSVar3->right);
          local_40 = slang::syntax::SyntaxNode::getFirstToken(pSVar5);
          SVar6 = Token::location(&local_40);
          pDVar7 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x640005,SVar6);
          SVar11 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)newKeyword);
          Diagnostic::operator<<(pDVar7,SVar11);
        }
      }
    }
    if (kind == OpenParenthesis) {
      argList = parseArgumentList(this);
    }
    else {
      bVar1 = slang::syntax::SyntaxFacts::isPossibleExpression(kind);
      if (bVar1) {
        if ((newKeyword->super_ExpressionSyntax).super_SyntaxNode.kind != ConstructorName) {
          local_40 = ParserBase::peek(&this->super_ParserBase);
          SVar6 = Token::location(&local_40);
          pDVar7 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x840005,SVar6);
          SVar11 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)newKeyword);
          Diagnostic::operator<<(pDVar7,SVar11);
        }
        pEVar2 = parseExpression(this);
        pCVar9 = slang::syntax::SyntaxFactory::copyClassExpression(&this->factory,newKeyword,pEVar2)
        ;
        return &pCVar9->super_ExpressionSyntax;
      }
      argList = (ArgumentListSyntax *)0x0;
    }
    pNVar8 = (NewArrayExpressionSyntax *)
             slang::syntax::SyntaxFactory::newClassExpression(&this->factory,newKeyword,argList);
  }
  return &pNVar8->super_ExpressionSyntax;
}

Assistant:

ExpressionSyntax& Parser::parseNewExpression(NameSyntax& newKeyword,
                                             bitmask<ExpressionOptions> options) {
    // If we see an open bracket, this is a dynamic array new expression.
    auto kind = peek().kind;
    if (kind == TokenKind::OpenBracket) {
        auto openBracket = consume();
        auto& sizeExpr = parseExpression();
        auto closeBracket = expect(TokenKind::CloseBracket);

        ParenthesizedExpressionSyntax* initializer = nullptr;
        if (peek(TokenKind::OpenParenthesis)) {
            auto openParen = consume();
            auto& initializerExpr = parseExpression();
            initializer = &factory.parenthesizedExpression(openParen, initializerExpr,
                                                           expect(TokenKind::CloseParenthesis));
        }
        return factory.newArrayExpression(newKeyword, openBracket, sizeExpr, closeBracket,
                                          initializer);
    }

    // Enforce rules for super.new placement.
    if (newKeyword.kind == SyntaxKind::ScopedName) {
        auto& scoped = newKeyword.as<ScopedNameSyntax>();
        if (scoped.right->kind == SyntaxKind::ConstructorName &&
            scoped.left->getLastToken().kind == TokenKind::SuperKeyword) {
            if ((options & ExpressionOptions::AllowSuperNewCall) == 0) {
                addDiag(diag::InvalidSuperNew, scoped.right->getFirstToken().location())
                    << newKeyword.sourceRange();
            }
        }
    }

    // Otherwise this is a new-class or copy-class expression.
    // new-class has an optional argument list, copy-class has a required expression.
    // An open paren here would be ambiguous between an arg list and a parenthesized
    // expression -- we resolve by always taking the arg list.
    if (kind == TokenKind::OpenParenthesis)
        return factory.newClassExpression(newKeyword, &parseArgumentList());

    if (isPossibleExpression(kind)) {
        if (newKeyword.kind != SyntaxKind::ConstructorName)
            addDiag(diag::ScopedClassCopy, peek().location()) << newKeyword.sourceRange();
        return factory.copyClassExpression(newKeyword, parseExpression());
    }

    return factory.newClassExpression(newKeyword, nullptr);
}